

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.cpp
# Opt level: O3

ssize_t __thiscall
xmrig::Threads<xmrig::CpuThreads>::read
          (Threads<xmrig::CpuThreads> *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  Value *profile;
  ulong uVar1;
  long lVar2;
  Value *value;
  CpuThreads threads;
  CpuThreads local_50;
  
  uVar1 = (ulong)*(uint *)CONCAT44(in_register_00000034,__fd);
  if (uVar1 != 0) {
    value = (Value *)((*(ulong *)((uint *)CONCAT44(in_register_00000034,__fd) + 2) & 0xffffffffffff)
                     + 0x10);
    lVar2 = uVar1 << 5;
    do {
      if ((ushort)((value->data_).f.flags - 3) < 2) {
        CpuThreads::CpuThreads(&local_50,value);
        if (local_50.m_data.super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_50.m_data.super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          profile = (Value *)((ulong)value[-1].data_.s.str & 0xffffffffffff);
          if ((value[-1].data_.f.flags >> 0xc & 1) != 0) {
            profile = value + -1;
          }
          move(this,(char *)profile,&local_50);
        }
        if (local_50.m_data.super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.m_data.
                          super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
      }
      value = value + 2;
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != 0);
  }
  return (this->m_profiles)._M_t._M_impl.super__Rb_tree_header._M_node_count;
}

Assistant:

size_t xmrig::Threads<T>::read(const rapidjson::Value &value)
{
    using namespace rapidjson;

    for (auto &member : value.GetObject()) {
        if (member.value.IsArray() || member.value.IsObject()) {
            T threads(member.value);

            if (!threads.isEmpty()) {
                move(member.name.GetString(), std::move(threads));
            }
        }
    }
    for (auto &member : value.GetObject()) {
        if (member.value.IsArray() || member.value.IsObject()) {
            continue;
        }
    }

    return m_profiles.size();
}